

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char(&)[128],char,unsigned_int_const&>
          (String *__return_storage_ptr__,kj *this,char (*params) [128],char *params_1,
          uint *params_2)

{
  char (*value) [128];
  char *value_00;
  kj *this_00;
  uint *value_01;
  CappedArray<char,_14UL> local_58;
  char local_39 [1];
  ArrayPtr<const_char> local_38;
  uint *local_28;
  uint *params_local_2;
  char *params_local_1;
  char (*params_local) [128];
  
  local_28 = (uint *)params_1;
  params_local_2 = (uint *)params;
  params_local_1 = (char *)this;
  params_local = (char (*) [128])__return_storage_ptr__;
  value = char((char (*) [128])this);
  local_38 = toCharSequence<char(&)[128]>(value);
  value_00 = fwd<char>((NoInfer<char> *)params_local_2);
  local_39[0] = (char)toCharSequence<char>(value_00);
  this_00 = (kj *)fwd<unsigned_int_const&>(local_28);
  toCharSequence<unsigned_int_const&>(&local_58,this_00,value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)local_39,
             (FixedArray<char,_1UL> *)&local_58,(CappedArray<char,_14UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}